

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

UBool __thiscall
icu_63::enumGroupNames
          (icu_63 *this,UCharNames *names,uint16_t *group,UChar32 start,UChar32 end,
          UEnumCharNamesFn *fn,void *context,UCharNameChoice nameChoice)

{
  icu_63 iVar1;
  icu_63 iVar2;
  icu_63 *piVar3;
  UBool UVar4;
  uint16_t uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ushort uVar8;
  icu_63 *piVar9;
  icu_63 *piVar10;
  short sVar11;
  UCharNameChoice UVar12;
  icu_63 *piVar13;
  short sVar14;
  uint uVar15;
  icu_63 *piVar16;
  bool bVar17;
  uint16_t lengths [34];
  uint16_t offsets [34];
  char buffer [200];
  uint16_t local_198 [40];
  uint16_t local_148 [40];
  char local_f8 [200];
  
  puVar6 = expandGroupLengths((uint8_t *)
                              (this + (ulong)*(uint *)(this + 8) +
                                      (long)(int)((uint)group & 0xffff | (int)names << 0x10)),
                              local_148,local_198);
  if (fn == (UEnumCharNamesFn *)0x0) {
    if (start <= end) {
      piVar3 = *context;
      do {
        uVar7 = (ulong)((start & 0x1fU) * 2);
        piVar10 = (icu_63 *)(puVar6 + *(ushort *)((long)local_148 + uVar7));
        sVar14 = *(short *)((long)local_198 + uVar7);
        piVar13 = piVar3;
        if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
joined_r0x0035e8bd:
          piVar9 = piVar13;
          if (sVar14 != 0) {
            piVar16 = piVar10;
            while( true ) {
              sVar11 = sVar14 + -1;
              piVar10 = piVar16 + 1;
              uVar8 = (ushort)(byte)*piVar16;
              uVar15 = (uint)uVar8;
              if (*(ushort *)(this + 0x10) <= uVar8) break;
              uVar8 = *(ushort *)(this + (ulong)uVar8 * 2 + 0x12);
              if (uVar8 == 0xfffe) {
                piVar10 = piVar16 + 2;
                uVar8 = *(ushort *)
                         (this + (ulong)(uVar15 * 0x200 + (uint)(byte)piVar16[1] * 2) + 0x12);
                sVar11 = sVar14 + -2;
              }
              sVar14 = sVar11;
              if (uVar8 != 0xffff) {
                piVar9 = this + (ulong)uVar8 + (ulong)*(uint *)this;
                goto LAB_0035e970;
              }
              sVar11 = sVar14;
              if (uVar15 != 0x3b) goto LAB_0035e954;
              piVar9 = piVar13;
              if (((piVar13 != piVar3 || nameChoice != U_EXTENDED_CHAR_NAME) ||
                  (piVar9 = piVar3, *(short *)(this + 0x88) != -1)) ||
                 (piVar16 = piVar10, sVar14 == 0)) goto LAB_0035e98c;
            }
            piVar9 = piVar13;
            if (uVar15 == 0x3b) goto LAB_0035e98c;
LAB_0035e954:
            if (*piVar16 != *piVar13) goto LAB_0035e992;
            piVar13 = piVar13 + 1;
            sVar14 = sVar11;
            goto joined_r0x0035e8bd;
          }
          goto LAB_0035e98c;
        }
        UVar12 = nameChoice;
        if ((*(ushort *)(this + 0x10) < 0x3c) || (piVar9 = piVar3, *(short *)(this + 0x88) == -1)) {
          do {
            sVar11 = sVar14;
            if (sVar14 == 0) {
              sVar14 = 0;
            }
            else {
              do {
                sVar14 = sVar11 + -1;
                iVar1 = *piVar10;
                piVar10 = piVar10 + 1;
                if (iVar1 == (icu_63)0x3b) break;
                bVar17 = sVar11 != 1;
                sVar11 = sVar14;
              } while (bVar17);
            }
            bVar17 = 1 < (int)UVar12;
            UVar12 = UVar12 - U_UNICODE_10_CHAR_NAME;
          } while (bVar17);
          goto joined_r0x0035e8bd;
        }
LAB_0035e98c:
        if (*piVar9 == (icu_63)0x0) {
          *(UChar32 *)((long)context + 8) = start;
          return '\0';
        }
LAB_0035e992:
        bVar17 = start != end;
        start = start + 1;
      } while (bVar17);
    }
  }
  else if (start <= end) {
    do {
      uVar7 = (ulong)((start & 0x1fU) * 2);
      uVar5 = expandName((UCharNames *)this,puVar6 + *(ushort *)((long)local_148 + uVar7),
                         *(uint16_t *)((long)local_198 + uVar7),nameChoice,local_f8,200);
      if ((nameChoice == U_EXTENDED_CHAR_NAME) && (uVar5 == 0)) {
        uVar5 = getExtName(start,local_f8,200);
        local_f8[uVar5] = '\0';
      }
      if ((uVar5 != 0) &&
         (UVar4 = (*fn)(context,start,nameChoice,local_f8,(int32_t)uVar5), UVar4 == '\0')) {
        return '\0';
      }
      start = start + 1;
    } while (end + 1U != start);
  }
  return '\x01';
LAB_0035e970:
  iVar1 = *piVar9;
  if (iVar1 == (icu_63)0x0) goto joined_r0x0035e8bd;
  piVar9 = piVar9 + 1;
  iVar2 = *piVar13;
  piVar13 = piVar13 + 1;
  if (iVar1 != iVar2) goto LAB_0035e992;
  goto LAB_0035e970;
}

Assistant:

static UBool
enumGroupNames(UCharNames *names, const uint16_t *group,
               UChar32 start, UChar32 end,
               UEnumCharNamesFn *fn, void *context,
               UCharNameChoice nameChoice) {
    uint16_t offsets[LINES_PER_GROUP+2], lengths[LINES_PER_GROUP+2];
    const uint8_t *s=(uint8_t *)names+names->groupStringOffset+GET_GROUP_OFFSET(group);

    s=expandGroupLengths(s, offsets, lengths);
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;

        while(start<=end) {
            length=expandName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, buffer, sizeof(buffer));
            if (!length && nameChoice == U_EXTENDED_CHAR_NAME) {
                buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            }
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, nameChoice, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    } else {
        const char *otherName=((FindName *)context)->otherName;
        while(start<=end) {
            if(compareName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, otherName)) {
                ((FindName *)context)->code=start;
                return FALSE;
            }
            ++start;
        }
    }
    return TRUE;
}